

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void musig_test_set_secnonce
               (secp256k1_musig_secnonce *secnonce,uchar *secnonce64,secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_scalar k [2];
  secp256k1_ge pk;
  secp256k1_scalar sStack_c8;
  secp256k1_scalar local_a8;
  secp256k1_ge local_80;
  
  secp256k1_scalar_set_b32(&sStack_c8,secnonce64,(int *)0x0);
  secp256k1_scalar_set_b32(&local_a8,secnonce64 + 0x20,(int *)0x0);
  iVar1 = secp256k1_pubkey_load(CTX,&local_80,pubkey);
  if (iVar1 != 0) {
    secp256k1_musig_secnonce_save(secnonce,&sStack_c8,&local_80);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
          ,0x35c,"test condition failed: secp256k1_pubkey_load(CTX, &pk, pubkey)");
  abort();
}

Assistant:

static void musig_test_set_secnonce(secp256k1_musig_secnonce *secnonce, const unsigned char *secnonce64, const secp256k1_pubkey *pubkey) {
    secp256k1_ge pk;
    secp256k1_scalar k[2];

    secp256k1_scalar_set_b32(&k[0], &secnonce64[0], NULL);
    secp256k1_scalar_set_b32(&k[1], &secnonce64[32], NULL);
    CHECK(secp256k1_pubkey_load(CTX, &pk, pubkey));
    secp256k1_musig_secnonce_save(secnonce, k, &pk);
}